

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

void __thiscall
Connection::Connection
          (Connection *this,int client_socket,int forwarding_socket,sockaddr_in *serveraddr)

{
  pointer pcVar1;
  uint uVar2;
  runtime_error *this_00;
  int *piVar3;
  long *plVar4;
  socklen_t __len;
  long *plVar5;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *__addr;
  int __fd;
  vector<char,_std::allocator<char>_> local_78;
  long lStack_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  size_type __n;
  
  this->kMaxTimeout = 0x80;
  this->kBufSize = 0x1000;
  this->client_socket_ = client_socket;
  this->forwarding_socket_ = forwarding_socket;
  this->data_c_f_ = 0;
  this->data_f_c_ = 0;
  this->serveraddr_ = serveraddr;
  (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->connected = false;
  this->active_ = true;
  uVar2 = fcntl(forwarding_socket,3,0);
  __len = (socklen_t)serveraddr;
  fcntl(forwarding_socket,4,(ulong)(uVar2 | 0x800));
  std::vector<char,_std::allocator<char>_>::vector
            (&local_78,this->kBufSize,(allocator_type *)local_50);
  pcVar1 = (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
    if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  __n = this->kBufSize;
  std::vector<char,_std::allocator<char>_>::vector(&local_78,__n,(allocator_type *)local_50);
  __fd = (int)__n;
  pcVar1 = (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __addr = extraout_RDX;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
    __addr = extraout_RDX_00;
    if (local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
      __addr = extraout_RDX_01;
    }
  }
  if (this->forwarding_socket_ != -1) {
    connect(this,__fd,__addr,__len);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"socket: ","");
  piVar3 = __errno_location();
  strerror(*piVar3);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)*plVar4;
  plVar5 = plVar4 + 2;
  if ((long *)local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start == plVar5) {
    local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar5;
    lStack_60 = plVar4[3];
    local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar5;
  }
  local_78.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_78);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Connection::Connection(int client_socket, int forwarding_socket, sockaddr_in *serveraddr) :
        connected(false),
        forwarding_socket_(forwarding_socket),
        serveraddr_(serveraddr),
        client_socket_(client_socket),
        kMaxTimeout(128),
        kBufSize(4096),
        data_c_f_(0),
        data_f_c_(0),
        active_(true) {
    fcntl(forwarding_socket_, F_SETFL, fcntl(forwarding_socket_, F_GETFL, 0) | O_NONBLOCK);
    buf_cf_ = std::vector<char>(kBufSize);
    buf_fc_ = std::vector<char>(kBufSize);
    if (forwarding_socket_ == -1) {
        throw std::runtime_error(std::string("socket: ") + strerror(errno));
    }
    connect();
}